

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeTransferError(Vdbe *p)

{
  u8 uVar1;
  int err_code;
  sqlite3 *db_00;
  u8 mallocFailed;
  int rc;
  sqlite3 *db;
  Vdbe *p_local;
  
  db_00 = p->db;
  err_code = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    sqlite3Error(db_00,err_code,(char *)0x0);
  }
  else {
    uVar1 = db_00->mallocFailed;
    sqlite3BeginBenignMalloc();
    sqlite3ValueSetStr(db_00->pErr,-1,p->zErrMsg,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3EndBenignMalloc();
    db_00->mallocFailed = uVar1;
    db_00->errCode = err_code;
  }
  return err_code;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    u8 mallocFailed = db->mallocFailed;
    sqlite3BeginBenignMalloc();
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->mallocFailed = mallocFailed;
    db->errCode = rc;
  }else{
    sqlite3Error(db, rc, 0);
  }
  return rc;
}